

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMethods.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::builtins::StringGetcMethod::eval
          (StringGetcMethod *this,EvalContext *context,Args *args,SourceRange param_4,
          SystemCallInfo *param_5)

{
  int iVar1;
  bool bVar2;
  string *this_00;
  SVInt *this_01;
  optional<int> oVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  SVInt *pSVar4;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_RCX;
  ConstantValue *in_RDI;
  int32_t index;
  string *str;
  ConstantValue indexCv;
  ConstantValue strCv;
  SVInt *in_stack_fffffffffffffef8;
  EvalContext *in_stack_ffffffffffffff00;
  Expression *in_stack_ffffffffffffff08;
  bitwidth_t bits;
  string *this_03;
  
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RCX,0);
  Expression::eval(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RCX,1);
  Expression::eval(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  bVar2 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0xb1a88e);
  if ((bVar2) &&
     (bVar2 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0xb1a8ab), bVar2)) {
    this_00 = slang::ConstantValue::str_abi_cxx11_((ConstantValue *)0xb1a911);
    this_03 = this_00;
    this_01 = slang::ConstantValue::integer((ConstantValue *)0xb1a92f);
    oVar3 = SVInt::as<int>((SVInt *)this_03);
    bits = oVar3.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
           _4_4_;
    this_02 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::optional<int>::value((optional<int> *)in_stack_ffffffffffffff00);
    iVar1 = *(int *)&(this_02->_M_dataplus)._M_p;
    if (-1 < iVar1) {
      in_stack_fffffffffffffef8 = (SVInt *)(long)iVar1;
      pSVar4 = (SVInt *)std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::length
                                  (this_00);
      if (in_stack_fffffffffffffef8 < pSVar4) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                  (this_02,(size_type)in_stack_fffffffffffffef8);
        SVInt::SVInt(this_01,bits,(uint64_t)this_02,
                     SUB81((ulong)in_stack_fffffffffffffef8 >> 0x38,0));
        slang::ConstantValue::ConstantValue((ConstantValue *)this_02,in_stack_fffffffffffffef8);
        SVInt::~SVInt(this_01);
        goto LAB_00b1aa58;
      }
    }
    SVInt::SVInt(this_01,bits,(uint64_t)this_02,SUB81((ulong)in_stack_fffffffffffffef8 >> 0x38,0));
    slang::ConstantValue::ConstantValue((ConstantValue *)this_02,in_stack_fffffffffffffef8);
    SVInt::~SVInt(this_01);
  }
  else {
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  }
LAB_00b1aa58:
  slang::ConstantValue::~ConstantValue((ConstantValue *)0xb1aa65);
  slang::ConstantValue::~ConstantValue((ConstantValue *)0xb1aa72);
  return in_RDI;
}

Assistant:

ConstantValue eval(EvalContext& context, const Args& args, SourceRange,
                       const CallExpression::SystemCallInfo&) const final {
        auto strCv = args[0]->eval(context);
        auto indexCv = args[1]->eval(context);
        if (!strCv || !indexCv)
            return nullptr;

        const std::string& str = strCv.str();
        int32_t index = indexCv.integer().as<int32_t>().value();
        if (index < 0 || size_t(index) >= str.length())
            return SVInt(8, 0, false);

        return SVInt(8, uint64_t(str[size_t(index)]), false);
    }